

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t gnu_sparse_01_parse(archive_read *a,tar *tar,char *p)

{
  char cVar1;
  wchar_t wVar2;
  int64_t size;
  int64_t remaining;
  char *pcVar3;
  size_t char_cnt;
  long offset;
  
  offset = -1;
  do {
    for (char_cnt = 0; (cVar1 = p[char_cnt], cVar1 != '\0' && (cVar1 != ','));
        char_cnt = char_cnt + 1) {
      if ((byte)(cVar1 - 0x3aU) < 0xf6) {
        return L'\xffffffec';
      }
    }
    remaining = tar_atol_base_n(p,char_cnt,L'\n');
    if (offset < 0) {
      if (remaining < 0) {
        return L'\xffffffec';
      }
    }
    else {
      if (remaining < 0) {
        return L'\xffffffec';
      }
      wVar2 = gnu_add_sparse_entry(a,tar,offset,remaining);
      remaining = -1;
      if (wVar2 != L'\0') {
        return L'\xffffffe2';
      }
    }
    pcVar3 = p + char_cnt;
    p = pcVar3 + 1;
    offset = remaining;
    if (*pcVar3 == '\0') {
      return L'\0';
    }
  } while( true );
}

Assistant:

static int
gnu_sparse_01_parse(struct archive_read *a, struct tar *tar, const char *p)
{
	const char *e;
	int64_t offset = -1, size = -1;

	for (;;) {
		e = p;
		while (*e != '\0' && *e != ',') {
			if (*e < '0' || *e > '9')
				return (ARCHIVE_WARN);
			e++;
		}
		if (offset < 0) {
			offset = tar_atol10(p, e - p);
			if (offset < 0)
				return (ARCHIVE_WARN);
		} else {
			size = tar_atol10(p, e - p);
			if (size < 0)
				return (ARCHIVE_WARN);
			if (gnu_add_sparse_entry(a, tar, offset, size)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			offset = -1;
		}
		if (*e == '\0')
			return (ARCHIVE_OK);
		p = e + 1;
	}
}